

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ArgMaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argmax(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x401) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x401;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.argmax_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArgMaxLayerParams>
                   (arena);
    (this->layer_).argmax_ = (ArgMaxLayerParams *)LVar2;
  }
  return (ArgMaxLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMaxLayerParams* NeuralNetworkLayer::_internal_mutable_argmax() {
  if (!_internal_has_argmax()) {
    clear_layer();
    set_has_argmax();
    layer_.argmax_ = CreateMaybeMessage< ::CoreML::Specification::ArgMaxLayerParams >(GetArenaForAllocation());
  }
  return layer_.argmax_;
}